

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gogoing_util.cpp
# Opt level: O0

void going_set_snd_timeo(int sockfd,int sec,int usec)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *local_40;
  long lStack_28;
  int ret;
  timeval time;
  int usec_local;
  int sec_local;
  int sockfd_local;
  
  lStack_28 = (long)sec;
  time.tv_sec = (__time_t)usec;
  time.tv_usec._4_4_ = usec;
  iVar1 = setsockopt(sockfd,1,0x15,&stack0xffffffffffffffd8,0x10);
  __stream = _stderr;
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    if (*piVar2 == 0) {
      local_40 = "None";
    }
    else {
      piVar2 = __errno_location();
      local_40 = strerror(*piVar2);
    }
    fprintf(__stream,"[ERROR] (%s:%d: errno: %s) setsockopt: SO_SNDTIMEO failed.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/tangwz[P]Gogoing/src/Gogoing_util.cpp"
            ,0x15d,local_40);
    exit(-1);
  }
  return;
}

Assistant:

void going_set_snd_timeo(int sockfd, int sec, int usec)
 {
 	struct timeval time = {sec, usec};
 	int ret = setsockopt(sockfd, SOL_SOCKET, SO_SNDTIMEO, &time, sizeof(time));
 	if(ret < 0){
 		log_err("setsockopt: SO_SNDTIMEO failed.");
 		exit(-1);
 	}
 }